

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
DataFilters::addStringFilter
          (DataFilters *this,uint *index,string *pattern,bool *isExact,bool *isSensitive,
          bool *isAccept)

{
  uint uVar1;
  StringFilter local_78;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  bool local_28;
  bool bStack_27;
  bool local_26;
  
  uVar1 = *index;
  StringFilter::StringFilter(&local_78,pattern,isExact,isSensitive,isAccept);
  local_50._0_4_ = uVar1;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_78._pattern._M_dataplus._M_p,
             local_78._pattern._M_dataplus._M_p + local_78._pattern._M_string_length);
  local_26 = local_78._isAccept;
  local_28 = local_78._isExact;
  bStack_27 = local_78._isSensitive;
  std::vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>::
  emplace_back<DataFilters::StringFilterCase>(&this->_stringFilters,(StringFilterCase *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._pattern._M_dataplus._M_p != &local_78._pattern.field_2) {
    operator_delete(local_78._pattern._M_dataplus._M_p,
                    local_78._pattern.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    addStringFilter(unsigned int const & index,
                    std::string const & pattern,
                    bool const & isExact,
                    bool const & isSensitive,
                    bool const & isAccept)
    {
        this->_stringFilters.push_back(StringFilterCase(index, StringFilter(pattern, isExact, isSensitive, isAccept)));
    }